

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::VectorDeathTest_BoundsChecks_Test::TestBody
          (VectorDeathTest_BoundsChecks_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  StringLike<const_char_*> *regex_03;
  char *in_R9;
  pointer *__ptr;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar_;
  Vector<int> vec;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  AssertHelper local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  string local_e8;
  Vector<int> local_c8;
  AssertHelper local_b0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_90;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_60;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  local_c8.data_ = (int *)0x0;
  local_c8.size_ = 0;
  local_c8.capacity_ = 0;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_f8.data_ = (AssertHelperData *)0x53d1bf;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_e8,
               (testing *)&local_f8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_48,(PolymorphicMatcher *)&local_e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("vec.front()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_48,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xa9,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_48);
    _Var1._M_head_impl = local_100._M_head_impl;
    bVar3 = true;
    if (bVar4) {
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        iVar5 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
        _Var2._M_head_impl = local_100._M_head_impl;
        if (iVar5 == 0) {
          iVar5 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (**(code **)(*(long *)_Var2._M_head_impl + 0x20))(_Var2._M_head_impl,(ulong)bVar3)
          ;
          if ((char)iVar5 != '\0') goto LAB_003287df;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3 && local_c8.size_ == 0) goto LAB_00328f90;
            (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
            (**(code **)(*(long *)_Var2._M_head_impl + 0x28))(_Var2._M_head_impl,0);
          }
LAB_003287df:
          bVar3 = false;
          bVar4 = true;
        }
        (**(code **)(*(long *)_Var1._M_head_impl + 8))(_Var1._M_head_impl);
        if (!bVar4) goto LAB_003287f2;
      }
      bVar3 = false;
    }
LAB_003287f2:
    if (bVar3) {
      if (!bVar3) goto LAB_00328f50;
      goto LAB_003287ff;
    }
  }
  else {
LAB_003287ff:
    testing::Message::Message((Message *)&local_e8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xa9,pcVar6);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((long *)local_e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_f8.data_ = (AssertHelperData *)0x53d1bf;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_e8,
               (testing *)&local_f8,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_60,(PolymorphicMatcher *)&local_e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("vec.back()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_60,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xaa,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_60);
    _Var1._M_head_impl = local_100._M_head_impl;
    bVar3 = true;
    if (bVar4) {
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        iVar5 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
        _Var2._M_head_impl = local_100._M_head_impl;
        if (iVar5 == 0) {
          iVar5 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (**(code **)(*(long *)_Var2._M_head_impl + 0x20))(_Var2._M_head_impl,(ulong)bVar3)
          ;
          if ((char)iVar5 != '\0') goto LAB_00328960;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3 && local_c8.size_ == 0) goto LAB_00328f90;
            (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
            (**(code **)(*(long *)_Var2._M_head_impl + 0x28))(_Var2._M_head_impl,0);
          }
LAB_00328960:
          bVar3 = false;
          bVar4 = true;
        }
        (**(code **)(*(long *)_Var1._M_head_impl + 8))(_Var1._M_head_impl);
        if (!bVar4) goto LAB_00328973;
      }
      bVar3 = false;
    }
LAB_00328973:
    if (bVar3) {
      if (!bVar3) goto LAB_00328f50;
      goto LAB_00328980;
    }
  }
  else {
LAB_00328980:
    testing::Message::Message((Message *)&local_e8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xaa,pcVar6);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((long *)local_e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_f8.data_ = (AssertHelperData *)0x53d1bf;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_e8,
               (testing *)&local_f8,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_78,(PolymorphicMatcher *)&local_e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("vec.pop_back()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xab,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    _Var1._M_head_impl = local_100._M_head_impl;
    iVar5 = 6;
    if (bVar3) {
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        iVar5 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
        _Var2._M_head_impl = local_100._M_head_impl;
        if (iVar5 == 0) {
          iVar5 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (**(code **)(*(long *)_Var2._M_head_impl + 0x20))(_Var2._M_head_impl,(ulong)bVar3)
          ;
          if ((char)iVar5 != '\0') goto LAB_00328ae8;
          iVar5 = 6;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              if (local_c8.size_ == 0) goto LAB_00328f90;
              local_c8.size_ = local_c8.size_ - 1;
            }
            (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
            (**(code **)(*(long *)_Var2._M_head_impl + 0x28))(_Var2._M_head_impl,0);
          }
LAB_00328ae8:
          iVar5 = 0;
          bVar3 = true;
        }
        (**(code **)(*(long *)_Var1._M_head_impl + 8))(_Var1._M_head_impl);
        if (!bVar3) goto LAB_00328afb;
      }
      iVar5 = 0;
    }
LAB_00328afb:
    if (iVar5 != 0) {
      if (iVar5 != 6) goto LAB_00328f50;
      goto LAB_00328b08;
    }
  }
  else {
LAB_00328b08:
    testing::Message::Message((Message *)&local_e8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xab,pcVar6);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((long *)local_e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = Vector<int>::MaybeGrow(&local_c8);
  if (bVar3) {
    local_c8.data_[local_c8.size_] = 1;
    local_c8.size_ = local_c8.size_ + 1;
  }
  local_f8.data_._0_1_ = bVar3;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)&local_f8,(AssertionResult *)"vec.Push(1)","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xac,local_e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    if (!bVar3) goto LAB_00328f50;
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_f8.data_ = (AssertHelperData *)0x53d1bf;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_e8,
               (testing *)&local_f8,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_90,(PolymorphicMatcher *)&local_e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("vec[1]",(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                 *)&local_90,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xae,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_90);
    _Var1._M_head_impl = local_100._M_head_impl;
    bVar3 = true;
    if (bVar4) {
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        iVar5 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
        _Var2._M_head_impl = local_100._M_head_impl;
        if (iVar5 == 0) {
          iVar5 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (**(code **)(*(long *)_Var2._M_head_impl + 0x20))(_Var2._M_head_impl,(ulong)bVar3)
          ;
          if ((char)iVar5 != '\0') goto LAB_00328d5b;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3 && local_c8.size_ < 2) goto LAB_00328f90;
            (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
            (**(code **)(*(long *)_Var2._M_head_impl + 0x28))(_Var2._M_head_impl,0);
          }
LAB_00328d5b:
          bVar3 = false;
          bVar4 = true;
        }
        (**(code **)(*(long *)_Var1._M_head_impl + 8))(_Var1._M_head_impl);
        if (!bVar4) goto LAB_00328d6e;
      }
      bVar3 = false;
    }
LAB_00328d6e:
    if (bVar3) {
      if (!bVar3) goto LAB_00328f50;
      goto LAB_00328d7b;
    }
  }
  else {
LAB_00328d7b:
    testing::Message::Message((Message *)&local_e8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xae,pcVar6);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((long *)local_e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_f8.data_ = (AssertHelperData *)0x53d1bf;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_e8,
               (testing *)&local_f8,regex_03);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a8,(PolymorphicMatcher *)&local_e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("vec[10000]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xb0,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a8);
    _Var1._M_head_impl = local_100._M_head_impl;
    iVar5 = 10;
    if (bVar3) {
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        iVar5 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
        _Var2._M_head_impl = local_100._M_head_impl;
        if (iVar5 == 0) {
          iVar5 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (**(code **)(*(long *)local_100._M_head_impl + 0x20))
                            (local_100._M_head_impl,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00328ee2;
          iVar5 = 10;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3 && local_c8.size_ < 0x2711) {
LAB_00328f90:
              abort();
            }
            (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
            (**(code **)(*(long *)_Var2._M_head_impl + 0x28))(_Var2._M_head_impl,0);
          }
LAB_00328ee2:
          iVar5 = 0;
          bVar3 = true;
        }
        (**(code **)(*(long *)_Var1._M_head_impl + 8))(_Var1._M_head_impl);
        if (!bVar3) goto LAB_00328ef5;
      }
      iVar5 = 0;
    }
LAB_00328ef5:
    if (iVar5 != 10) goto LAB_00328f50;
  }
  testing::Message::Message((Message *)&local_e8);
  pcVar6 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
             ,0xb0,pcVar6);
  testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e8);
  testing::internal::AssertHelper::~AssertHelper(&local_f8);
  if ((long *)local_e8._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
  }
LAB_00328f50:
  OPENSSL_free(local_c8.data_);
  return;
}

Assistant:

TEST(InplaceVectorTest, ComplexType) {
  InplaceVector<std::vector<int>, 4> vec_of_vecs;
  const std::vector<int> data[] = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  vec_of_vecs.CopyFrom(data);
  EXPECT_EQ(Span(vec_of_vecs), Span(data));

  vec_of_vecs.Resize(2);
  EXPECT_EQ(Span(vec_of_vecs), Span(data, 2));

  vec_of_vecs.PushBack({42});
  EXPECT_EQ(3u, vec_of_vecs.size());
  vec_of_vecs.pop_back();
  EXPECT_EQ(2u, vec_of_vecs.size());

  vec_of_vecs.Resize(4);
  EXPECT_EQ(4u, vec_of_vecs.size());
  EXPECT_EQ(vec_of_vecs[0], data[0]);
  EXPECT_EQ(vec_of_vecs[1], data[1]);
  EXPECT_TRUE(vec_of_vecs[2].empty());
  EXPECT_TRUE(vec_of_vecs[3].empty());

  // Copy-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs2 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs2.size());
  EXPECT_EQ(vec_of_vecs2[0], data[0]);
  EXPECT_EQ(vec_of_vecs2[1], data[1]);
  EXPECT_TRUE(vec_of_vecs2[2].empty());
  EXPECT_TRUE(vec_of_vecs2[3].empty());

  // Copy-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs3;
  vec_of_vecs3 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs3.size());
  EXPECT_EQ(vec_of_vecs3[0], data[0]);
  EXPECT_EQ(vec_of_vecs3[1], data[1]);
  EXPECT_TRUE(vec_of_vecs3[2].empty());
  EXPECT_TRUE(vec_of_vecs3[3].empty());

  // Move-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs4 = std::move(vec_of_vecs);
  EXPECT_EQ(4u, vec_of_vecs4.size());
  EXPECT_EQ(vec_of_vecs4[0], data[0]);
  EXPECT_EQ(vec_of_vecs4[1], data[1]);
  EXPECT_TRUE(vec_of_vecs4[2].empty());
  EXPECT_TRUE(vec_of_vecs4[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs.size());
  for (const auto &vec : vec_of_vecs) {
    EXPECT_TRUE(vec.empty());
  }

  // Move-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs5;
  vec_of_vecs5 = std::move(vec_of_vecs4);
  EXPECT_EQ(4u, vec_of_vecs5.size());
  EXPECT_EQ(vec_of_vecs5[0], data[0]);
  EXPECT_EQ(vec_of_vecs5[1], data[1]);
  EXPECT_TRUE(vec_of_vecs5[2].empty());
  EXPECT_TRUE(vec_of_vecs5[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs4.size());
  for (const auto &vec : vec_of_vecs4) {
    EXPECT_TRUE(vec.empty());
  }

  std::vector<int> v = {42};
  vec_of_vecs5.Resize(3);
  EXPECT_TRUE(vec_of_vecs5.TryPushBack(v));
  EXPECT_EQ(v, vec_of_vecs5[3]);
  EXPECT_FALSE(vec_of_vecs5.TryPushBack(v));
}